

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

double GetDifficulty(CBlockIndex *blockindex)

{
  long in_RDI;
  long in_FS_OFFSET;
  double dDiff;
  int nShift;
  double local_20;
  uint local_14;
  
  local_20 = 65535.0 / (double)(*(uint *)(in_RDI + 0x84) & 0xffffff);
  for (local_14 = (uint)*(byte *)(in_RDI + 0x87); (int)local_14 < 0x1d; local_14 = local_14 + 1) {
    local_20 = local_20 * 256.0;
  }
  for (; 0x1d < (int)local_14; local_14 = local_14 - 1) {
    local_20 = local_20 / 256.0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

double GetDifficulty(const CBlockIndex& blockindex)
{
    int nShift = (blockindex.nBits >> 24) & 0xff;
    double dDiff =
        (double)0x0000ffff / (double)(blockindex.nBits & 0x00ffffff);

    while (nShift < 29)
    {
        dDiff *= 256.0;
        nShift++;
    }
    while (nShift > 29)
    {
        dDiff /= 256.0;
        nShift--;
    }

    return dDiff;
}